

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O3

int ON_UuidPtr::CompareIdAndPtr(ON_UuidPtr *a,ON_UuidPtr *b)

{
  uint uVar1;
  
  if (a == (ON_UuidPtr *)0x0) {
    uVar1 = -(uint)(b != (ON_UuidPtr *)0x0);
  }
  else if (b == (ON_UuidPtr *)0x0) {
    uVar1 = 1;
  }
  else {
    uVar1 = ON_UuidCompare(&a->m_id,&b->m_id);
    if (uVar1 == 0) {
      uVar1 = 0xffffffff;
      if (b->m_ptr <= a->m_ptr) {
        uVar1 = (uint)(b->m_ptr < a->m_ptr);
      }
    }
  }
  return uVar1;
}

Assistant:

int ON_UuidPtr::CompareIdAndPtr( const ON_UuidPtr* a, const ON_UuidPtr* b )
{
  int i;
  if ( !a )
    return (b ? -1 : 0 );
  if ( !b )
    return 1;

  // compare id first
  if (0 == (i = ON_UuidCompare(&a->m_id, &b->m_id)))
  {
    if (a->m_ptr < b->m_ptr)
      i = -1;
    else if (a->m_ptr > b->m_ptr)
      i = 1;
  }

  return i;
}